

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_ocean_shore.c
# Opt level: O3

OceanWave * InitializeWave(double SR,float attackInSeconds,float maxLevel,float positionLeftRight)

{
  OceanWave *__s;
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  float fVar5;
  float in_XMM1_Db;
  uint in_XMM2_Db;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar6 [16];
  
  __s = (OceanWave *)PaUtil_AllocateMemory(0x250);
  if (__s != (OceanWave *)0x0) {
    lVar2 = (long)(int)InitializeWave::lastNoOfRows;
    bVar1 = (byte)InitializeWave::lastNoOfRows;
    iVar3 = InitializeWave::lastNoOfRows * 0x800000;
    (__s->wave_left).pink_Index = 0;
    (__s->wave_left).pink_IndexMask = ~(-1 << (bVar1 & 0x1f));
    (__s->wave_left).pink_Scalar = 1.0 / (float)(iVar3 + 0x800000);
    if (0 < lVar2) {
      memset(__s,0,lVar2 << 3);
    }
    (__s->wave_left).pink_RunningSum = 0;
    do {
      iVar3 = rand();
      uVar4 = ((int)((long)(iVar3 << 3) * 0x40000001 >> 0x3d) - ((iVar3 << 3) >> 0x1f)) + 0xc;
    } while (uVar4 == InitializeWave::lastNoOfRows);
    (__s->wave_right).pink_Index = 0;
    (__s->wave_right).pink_IndexMask = ~(-1 << ((byte)uVar4 & 0x1f));
    (__s->wave_right).pink_Scalar = 1.0 / (float)(int)(uVar4 * 0x800000 + 0x800000);
    memset(&__s->wave_right,0,(ulong)uVar4 << 3);
    (__s->wave_right).pink_RunningSum = 0;
    InitializeWave::lastNoOfRows = uVar4;
    __s->wave_envelope_state = State_kAttack;
    __s->wave_envelope_level = 0.0;
    auVar7._4_4_ = in_XMM2_Db;
    auVar7._0_4_ = maxLevel;
    __s->wave_envelope_max_level = maxLevel;
    auVar7._8_4_ = in_XMM2_Db;
    auVar7._12_4_ = in_XMM2_Db ^ 0x80000000;
    auVar6._8_8_ = auVar7._8_8_;
    auVar6._0_8_ = CONCAT44(maxLevel,maxLevel) ^ 0x8000000000000000;
    auVar8._4_4_ = (float)SR * attackInSeconds * 4.0;
    auVar8._0_4_ = (float)SR * attackInSeconds;
    auVar8._8_4_ = in_XMM1_Db * 0.0;
    auVar8._12_4_ = 0;
    auVar8 = divps(auVar6,auVar8);
    __s->wave_attack_incr = (float)(int)auVar8._0_8_;
    __s->wave_decay_incr = (float)(int)((ulong)auVar8._0_8_ >> 0x20);
    fVar5 = 1.0 - positionLeftRight;
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      fVar5 = SQRT(fVar5);
    }
    __s->wave_pan_left = fVar5;
    if (positionLeftRight < 0.0) {
      fVar5 = sqrtf(positionLeftRight);
    }
    else {
      fVar5 = SQRT(positionLeftRight);
    }
    __s->wave_pan_right = fVar5;
  }
  return __s;
}

Assistant:

OceanWave* InitializeWave(double SR, float attackInSeconds, float maxLevel, float positionLeftRight)
{
    OceanWave* wave = NULL;
    static unsigned lastNoOfRows = 12;
    unsigned newNoOfRows;

    wave = (OceanWave*)PaUtil_AllocateMemory(sizeof(OceanWave));
    if (wave != NULL)
    {
        InitializePinkNoise(&wave->wave_left, lastNoOfRows);
        while ((newNoOfRows = NEW_ROW_SIZE) == lastNoOfRows);
        InitializePinkNoise(&wave->wave_right, newNoOfRows);
        lastNoOfRows = newNoOfRows;

        wave->wave_envelope_state = State_kAttack;
        wave->wave_envelope_level = 0.f;
        wave->wave_envelope_max_level = maxLevel;
        wave->wave_attack_incr = wave->wave_envelope_max_level / (attackInSeconds * (float)SR);
        wave->wave_decay_incr = - wave->wave_envelope_max_level / (attackInSeconds * 4 * (float)SR);

        wave->wave_pan_left = sqrtf(1.0f - positionLeftRight);
        wave->wave_pan_right = sqrtf(positionLeftRight);
    }
    return wave;
}